

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomThreeAction::Pick(BlueRoomThreeAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  bool bVar4;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [36];
  itemType local_1c;
  BlueRoomThreeAction *local_18;
  BlueRoomThreeAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar4 = false;
  if (iVar1 == BALL) {
    local_1c = BALL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
    iVar2 = ItemWrapper::getLocation(this_00);
    bVar4 = iVar2 == B_ROOM3;
  }
  if (bVar4) {
    pAVar3 = (ActionResults *)operator_new(0x30);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "You pick up the weighty steel ball. It is no fanciful feat, but you feel accomplished none the less."
               ,&local_41);
    ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_40);
    local_55 = 0;
    this_local = (BlueRoomThreeAction *)pAVar3;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == PIPE) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,
                 "You attempt to pry loose a section of pipe, but the metal is so cold that you can only hold on for a second. No pipe shall you hold today."
                 ,&local_79);
      ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_78);
      this_local = (BlueRoomThreeAction *)pAVar3;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      this_local = (BlueRoomThreeAction *)AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * BlueRoomThreeAction::Pick() {
    if(commands->getMainItem() == BALL && itemList->getValue(BALL)->getLocation() == B_ROOM3){
        return new ActionResults(CURRENT, "You pick up the weighty steel ball. It is no fanciful feat, but you feel accomplished none the less.");
    } else if(commands->getMainItem() == PIPE){
        return new ActionResults(CURRENT, "You attempt to pry loose a section of pipe, but the metal is so cold that you can only hold on for a second. No pipe shall you hold today.");
    } else {
        return AbstractRoomAction::Pick();
    }
}